

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-output.c
# Opt level: O0

void display_area(wchar_t *text,uint8_t *attrs,size_t *line_starts,size_t *line_lengths,
                 size_t n_lines,region_conflict area,size_t line_from)

{
  ulong local_58;
  ulong local_48;
  size_t j;
  size_t i;
  size_t line_from_local;
  size_t n_lines_local;
  size_t *line_lengths_local;
  size_t *line_starts_local;
  uint8_t *attrs_local;
  wchar_t *text_local;
  
  local_58 = n_lines;
  if ((ulong)(long)area.page_rows < n_lines) {
    local_58 = (ulong)area.page_rows;
  }
  for (j = 0; j < local_58; j = j + 1) {
    Term_erase(area.col,area.row + (int)j,area.width);
    for (local_48 = 0; local_48 < line_lengths[line_from + j]; local_48 = local_48 + 1) {
      Term_putch(area.col + (int)local_48,area.row + (int)j,
                 (uint)attrs[line_starts[line_from + j] + local_48],
                 text[line_starts[line_from + j] + local_48]);
    }
  }
  return;
}

Assistant:

static void display_area(const wchar_t *text, const uint8_t *attrs,
		size_t *line_starts, size_t *line_lengths,
		size_t n_lines,
		region area, size_t line_from)
{
	size_t i, j;

	n_lines = MIN(n_lines, (size_t) area.page_rows);

	for (i = 0; i < n_lines; i++) {
		Term_erase(area.col, area.row + i, area.width);
		for (j = 0; j < line_lengths[line_from + i]; j++) {
			Term_putch(area.col + j, area.row + i,
					attrs[line_starts[line_from + i] + j],
					text[line_starts[line_from + i] + j]);
		}
	}
}